

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

UploadSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
          *samples,bool logBucketPerformance)

{
  pointer pUVar1;
  pointer pUVar2;
  float fVar3;
  float fVar4;
  int *piVar5;
  SampleBuilder *pSVar6;
  offset_in_SampleType_to_deUint64 in_RCX;
  ulong uVar7;
  string *psVar8;
  LogNumber<float> *pLVar9;
  long lVar10;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  void *__buf_15;
  void *__buf_16;
  void *__buf_17;
  void *__buf_18;
  void *__buf_19;
  void *__buf_20;
  void *__buf_21;
  void *__buf_22;
  void *__buf_23;
  void *__buf_24;
  void *__buf_25;
  void *__buf_26;
  void *__buf_27;
  void *__buf_28;
  void *__buf_29;
  void *__buf_30;
  void *__buf_31;
  long lVar11;
  int __fd;
  size_type __n;
  ulong uVar12;
  ulong uVar13;
  ulong in_R9;
  uint uVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  float xmin;
  float fVar18;
  float xmin_00;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float xmax;
  float xmax_00;
  float fVar23;
  float fVar24;
  float fVar25;
  UploadSampleAnalyzeResult UVar26;
  allocator<char> local_b09;
  allocator<char> local_b08;
  allocator<char> local_b07;
  allocator<char> local_b06;
  allocator<char> local_b05;
  allocator<char> local_b04;
  allocator<char> local_b03;
  allocator<char> local_b02;
  allocator<char> local_b01;
  allocator<char> local_b00;
  allocator<char> local_aff;
  allocator<char> local_afe;
  allocator<char> local_afd;
  float local_afc;
  allocator<char> local_af7;
  allocator<char> local_af6;
  allocator<char> local_af5;
  allocator<char> local_af4;
  allocator<char> local_af3;
  allocator<char> local_af2;
  allocator<char> local_af1;
  allocator<char> local_af0;
  allocator<char> local_aef;
  allocator<char> local_aee;
  allocator<char> local_aed;
  allocator<char> local_aec;
  allocator<char> local_aeb;
  allocator<char> local_aea;
  allocator<char> local_ae9;
  allocator<char> local_ae8;
  allocator<char> local_ae7;
  allocator<char> local_ae6;
  allocator<char> local_ae5;
  allocator<char> local_ae4;
  allocator<char> local_ae3;
  allocator<char> local_ae2;
  allocator<char> local_ae1;
  LineParametersWithConfidence contributionFitting;
  vector<float,_std::allocator<float>_> processingRates;
  LineParametersWithConfidence theilSenFitting;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  ScopedLogSection section_2;
  string local_980;
  string local_960;
  string local_940;
  string local_920;
  string local_900;
  string local_8e0;
  string local_8c0;
  string local_8a0;
  string local_880;
  ScopedLogSection section_1;
  LogNumber<float> local_840;
  LogNumber<float> local_7d8;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  LogNumber<float> local_5f0;
  LogNumber<float> local_588;
  LogNumber<float> local_520;
  LogNumber<float> local_4b8;
  LogNumber<float> local_450;
  LogNumber<float> local_3e8;
  LogNumber<float> local_380;
  LogNumber<float> local_318;
  ScopedLogSection section;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  StatsType resultStats;
  
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>>
            (&theilSenFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
              *)0x28,in_RCX);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&values,(long)(samples->
                           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(samples->
                           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 6,
             (allocator_type *)&processingRates);
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(samples->
              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1 >> 6;
  lVar10 = 0;
  uVar13 = 0;
  if (0 < (int)__n) {
    uVar13 = __n & 0xffffffff;
  }
  for (; uVar13 * 8 != lVar10; lVar10 = lVar10 + 8) {
    *(deUint64 *)
     ((long)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start + lVar10) =
         (&(pUVar1->duration).fitResponseDuration)[lVar10];
  }
  std::vector<float,_std::allocator<float>_>::vector
            (&processingRates,__n,(allocator_type *)&local_840);
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (ulong)((long)(samples->
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 6;
  uVar12 = 0;
  uVar13 = uVar7 & 0xffffffff;
  if ((int)uVar7 < 1) {
    uVar13 = uVar12;
  }
  piVar5 = &pUVar1->writtenSize;
  for (; uVar13 != uVar12; uVar12 = uVar12 + 1) {
    uVar7 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12];
    if ((long)uVar7 < 0) {
      in_R9 = uVar7 >> 1;
    }
    *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_) + uVar12 * 4) =
         (float)*piVar5 / (((float)uVar7 / 1000.0) / 1000.0);
    piVar5 = piVar5 + 0x10;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_),
             CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_));
  resultStats.medianRate =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.5);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&processingRates.super__Vector_base<float,_std::allocator<float>_>);
  std::vector<float,_std::allocator<float>_>::vector
            (&processingRates,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&local_840);
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (ulong)((long)(samples->
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 6;
  uVar12 = 0;
  uVar13 = uVar7 & 0xffffffff;
  if ((int)uVar7 < 1) {
    uVar13 = uVar12;
  }
  piVar5 = &pUVar1->writtenSize;
  for (; uVar13 != uVar12; uVar12 = uVar12 + 1) {
    uVar7 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12];
    if ((long)uVar7 < 0) {
      in_R9 = uVar7 >> 1;
    }
    *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_) + uVar12 * 4) =
         (float)uVar7 - ((float)*piVar5 * theilSenFitting.coefficient + theilSenFitting.offset);
    piVar5 = piVar5 + 0x10;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_),
             CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_));
  resultStats.maxDiffTime =
       *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._4_4_,
                           processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._0_4_) + -4);
  resultStats.maxDiff9DecileTime =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.9);
  resultStats.medianDiffTime =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.5);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&processingRates.super__Vector_base<float,_std::allocator<float>_>);
  std::vector<float,_std::allocator<float>_>::vector
            (&processingRates,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&local_840);
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (ulong)((long)(samples->
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 6;
  uVar12 = 0;
  uVar13 = uVar7 & 0xffffffff;
  if ((int)uVar7 < 1) {
    uVar13 = uVar12;
  }
  piVar5 = &pUVar1->writtenSize;
  for (; uVar13 != uVar12; uVar12 = uVar12 + 1) {
    fVar16 = (float)*piVar5 * theilSenFitting.coefficient + theilSenFitting.offset;
    fVar21 = 0.0;
    if (1.0 <= fVar16) {
      uVar7 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12];
      if ((long)uVar7 < 0) {
        in_R9 = uVar7 >> 1;
      }
      fVar21 = ((float)uVar7 - fVar16) / fVar16;
    }
    *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_) + uVar12 * 4) = fVar21;
    piVar5 = piVar5 + 0x10;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_),
             CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_));
  resultStats.maxRelDiffTime =
       *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._4_4_,
                           processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._0_4_) + -4);
  resultStats.max9DecileRelDiffTime =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.9);
  resultStats.medianRelDiffTime =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.5);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&processingRates.super__Vector_base<float,_std::allocator<float>_>);
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start,
             values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish);
  uVar13 = *values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar7 = uVar13;
  if ((long)uVar13 < 0) {
    uVar7 = (ulong)((uint)uVar13 & 1) | uVar13 >> 1;
  }
  resultStats.result.minTime = (float)uVar13;
  uVar13 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  if ((long)uVar13 < 0) {
    uVar7 = uVar13 >> 1;
  }
  resultStats.result.maxTime = (float)uVar13;
  resultStats.result.medianTime =
       linearSample<unsigned_long>
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,0.5);
  resultStats.result.min2DecileTime =
       linearSample<unsigned_long>
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,0.1);
  resultStats.result.max9DecileTime =
       linearSample<unsigned_long>
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,0.9);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>>
            (&resultStats.map,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
              *)0x0,uVar7);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>>
            (&resultStats.unmap,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
              *)0x8,uVar7);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>>
            (&resultStats.write,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
              *)0x10,uVar7);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>>
            (&resultStats.flush,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
              *)0x18,uVar7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&values,"Samples",(allocator<char> *)&local_840);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&processingRates,"Samples",(allocator<char> *)&local_7d8);
  psVar8 = (string *)&processingRates;
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&values,psVar8);
  std::__cxx11::string::~string((string *)&processingRates);
  std::__cxx11::string::~string((string *)&values);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_520,"Samples",(allocator<char> *)&local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_588,"Samples",(allocator<char> *)&local_150);
  tcu::LogSampleList::LogSampleList((LogSampleList *)&local_4b8,&local_520.m_name,&local_588.m_name)
  ;
  __fd = (int)log;
  tcu::LogSampleList::write((LogSampleList *)&local_4b8,__fd,__buf,(size_t)psVar8);
  tcu::TestLog::startSampleInfo(log);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f0,"WrittenSize",(allocator<char> *)&local_170);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contributionFitting,"Written size",(allocator<char> *)&local_190);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section_1,"bytes",(allocator<char> *)&local_1b0);
  psVar8 = (string *)&section_1;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&values,&local_5f0.m_name,(string *)&contributionFitting,psVar8,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::LogValueInfo::write((LogValueInfo *)&values,__fd,__buf_00,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_880,"BufferSize",(allocator<char> *)&local_1d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8a0,"Buffer size",(allocator<char> *)&local_1f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c0,"bytes",(allocator<char> *)&local_210);
  psVar8 = &local_8c0;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&processingRates,&local_880,&local_8a0,psVar8,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::LogValueInfo::write((LogValueInfo *)&processingRates,__fd,__buf_01,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8e0,"TotalTime",(allocator<char> *)&local_230);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_900,"Total time",(allocator<char> *)&local_250);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_920,"us",(allocator<char> *)&local_270);
  psVar8 = &local_920;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_840,&local_8e0,&local_900,psVar8,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_840,__fd,__buf_02,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_940,"MapTime",(allocator<char> *)&local_290);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_960,"Map time",(allocator<char> *)&section_2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_980,"us",&local_afd);
  psVar8 = &local_980;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_7d8,&local_940,&local_960,psVar8,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_7d8,__fd,__buf_03,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_610,"UnmapTime",&local_afe);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_630,"Unmap time",&local_aff);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_650,"us",&local_b00);
  psVar8 = &local_650;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_318,&local_610,&local_630,psVar8,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_318,__fd,__buf_04,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_670,"WriteTime",&local_b01);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"Write time",&local_b02);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b0,"us",&local_b03);
  psVar8 = &local_6b0;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_380,&local_670,&local_690,psVar8,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_380,__fd,__buf_05,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d0,"FlushTime",&local_b04);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f0,"Flush time",&local_b05);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_710,"us",&local_b06);
  psVar8 = &local_710;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_3e8,&local_6d0,&local_6f0,psVar8,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_3e8,__fd,__buf_06,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_730,"FitResidual",&local_b07);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_750,"Fit residual",&local_b08)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_770,"us",&local_b09);
  psVar8 = &local_770;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_450,&local_730,&local_750,psVar8,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_450,__fd,__buf_07,(size_t)psVar8);
  tcu::TestLog::endSampleInfo(log);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_450);
  std::__cxx11::string::~string((string *)&local_770);
  std::__cxx11::string::~string((string *)&local_750);
  std::__cxx11::string::~string((string *)&local_730);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_710);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::__cxx11::string::~string((string *)&local_6d0);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_380);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::~string((string *)&local_670);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_318);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::~string((string *)&local_610);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_7d8);
  std::__cxx11::string::~string((string *)&local_980);
  std::__cxx11::string::~string((string *)&local_960);
  std::__cxx11::string::~string((string *)&local_940);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_840);
  std::__cxx11::string::~string((string *)&local_920);
  std::__cxx11::string::~string((string *)&local_900);
  std::__cxx11::string::~string((string *)&local_8e0);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&processingRates);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::__cxx11::string::~string((string *)&local_880);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&values);
  std::__cxx11::string::~string((string *)&section_1);
  std::__cxx11::string::~string((string *)&contributionFitting);
  std::__cxx11::string::~string((string *)&local_5f0);
  tcu::LogSampleList::~LogSampleList((LogSampleList *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_520);
  lVar11 = 0;
  for (lVar10 = 0;
      pUVar1 = (samples->
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      lVar10 < (int)((ulong)((long)(samples->
                                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 6)
      ; lVar10 = lVar10 + 1) {
    local_afc = (float)*(ulong *)((long)&(pUVar1->duration).fitResponseDuration + lVar11);
    fVar16 = (float)*(int *)((long)&pUVar1->writtenSize + lVar11) * theilSenFitting.coefficient +
             theilSenFitting.offset;
    values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._8_16_ = ZEXT416(0);
    values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)log;
    pSVar6 = tcu::SampleBuilder::operator<<
                       ((SampleBuilder *)&values,*(int *)((long)&pUVar1->writtenSize + lVar11));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&((samples->
                                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start)->
                                               bufferSize + lVar11));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).totalDuration + lVar11));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).mapDuration + lVar11));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).unmapDuration + lVar11));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).writeDuration + lVar11));
    pSVar6 = tcu::SampleBuilder::operator<<
                       (pSVar6,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).flushDuration + lVar11));
    pSVar6 = tcu::SampleBuilder::operator<<(pSVar6,local_afc - fVar16);
    tcu::SampleBuilder::operator<<(pSVar6,(EndSampleToken *)&tcu::TestLog::EndSample);
    std::_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>::
    ~_Vector_base((_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>
                   *)&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
    lVar11 = lVar11 + 0x40;
  }
  tcu::TestLog::endSampleList(log);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&values,"Contribution",(allocator<char> *)&local_840);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&processingRates,"Contributions",(allocator<char> *)&local_7d8);
  psVar8 = (string *)&processingRates;
  tcu::ScopedLogSection::ScopedLogSection(&section_1,log,(string *)&values,psVar8);
  std::__cxx11::string::~string((string *)&processingRates);
  std::__cxx11::string::~string((string *)&values);
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>>
            (&contributionFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
              *)0x0,(offset_in_SampleType_to_deUint64)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d8,"MapConstantCost",(allocator<char> *)&local_880);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_318,"Map: Approximated contant cost",(allocator<char> *)&local_8a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_380,"us",(allocator<char> *)&local_8c0);
  pLVar9 = &local_380;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,&local_7d8.m_name,&local_318.m_name,&pLVar9->m_name,
             QP_KEY_TAG_TIME,contributionFitting.offset);
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_08,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,"MapLinearCost",(allocator<char> *)&local_8e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"Map: Approximated linear cost",(allocator<char> *)&local_900);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b8,"us / MB",(allocator<char> *)&local_920);
  pLVar9 = &local_4b8;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_3e8.m_name,&local_450.m_name,
             &pLVar9->m_name,QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_09,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_520,"MapMedianCost",(allocator<char> *)&local_940);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_588,"Map: Median cost",(allocator<char> *)&local_960);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f0,"us",(allocator<char> *)&local_980);
  pLVar9 = &local_5f0;
  tcu::LogNumber<float>::LogNumber
            (&local_840,&local_520.m_name,&local_588.m_name,&pLVar9->m_name,QP_KEY_TAG_TIME,
             resultStats.map.medianTime);
  tcu::LogNumber<float>::write(&local_840,__fd,__buf_10,(size_t)pLVar9);
  tcu::LogNumber<float>::~LogNumber(&local_840);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_520);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_3e8);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_7d8);
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>>
            (&contributionFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
              *)0x8,(offset_in_SampleType_to_deUint64)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d8,"UnmapConstantCost",(allocator<char> *)&local_880);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_318,"Unmap: Approximated contant cost",(allocator<char> *)&local_8a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_380,"us",(allocator<char> *)&local_8c0);
  pLVar9 = &local_380;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,&local_7d8.m_name,&local_318.m_name,&pLVar9->m_name,
             QP_KEY_TAG_TIME,contributionFitting.offset);
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_11,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,"UnmapLinearCost",(allocator<char> *)&local_8e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"Unmap: Approximated linear cost",(allocator<char> *)&local_900);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b8,"us / MB",(allocator<char> *)&local_920);
  pLVar9 = &local_4b8;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_3e8.m_name,&local_450.m_name,
             &pLVar9->m_name,QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_12,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_520,"UnmapMedianCost",(allocator<char> *)&local_940);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_588,"Unmap: Median cost",(allocator<char> *)&local_960);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f0,"us",(allocator<char> *)&local_980);
  pLVar9 = &local_5f0;
  tcu::LogNumber<float>::LogNumber
            (&local_840,&local_520.m_name,&local_588.m_name,&pLVar9->m_name,QP_KEY_TAG_TIME,
             resultStats.unmap.medianTime);
  tcu::LogNumber<float>::write(&local_840,__fd,__buf_13,(size_t)pLVar9);
  tcu::LogNumber<float>::~LogNumber(&local_840);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_520);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_3e8);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_7d8);
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>>
            (&contributionFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
              *)0x10,(offset_in_SampleType_to_deUint64)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d8,"WriteConstantCost",(allocator<char> *)&local_880);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_318,"Write: Approximated contant cost",(allocator<char> *)&local_8a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_380,"us",(allocator<char> *)&local_8c0);
  pLVar9 = &local_380;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,&local_7d8.m_name,&local_318.m_name,&pLVar9->m_name,
             QP_KEY_TAG_TIME,contributionFitting.offset);
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_14,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,"WriteLinearCost",(allocator<char> *)&local_8e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"Write: Approximated linear cost",(allocator<char> *)&local_900);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b8,"us / MB",(allocator<char> *)&local_920);
  pLVar9 = &local_4b8;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_3e8.m_name,&local_450.m_name,
             &pLVar9->m_name,QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_15,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_520,"WriteMedianCost",(allocator<char> *)&local_940);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_588,"Write: Median cost",(allocator<char> *)&local_960);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f0,"us",(allocator<char> *)&local_980);
  pLVar9 = &local_5f0;
  tcu::LogNumber<float>::LogNumber
            (&local_840,&local_520.m_name,&local_588.m_name,&pLVar9->m_name,QP_KEY_TAG_TIME,
             resultStats.write.medianTime);
  tcu::LogNumber<float>::write(&local_840,__fd,__buf_16,(size_t)pLVar9);
  tcu::LogNumber<float>::~LogNumber(&local_840);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_520);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_3e8);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_7d8);
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>>
            (&contributionFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
              *)0x18,(offset_in_SampleType_to_deUint64)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d8,"FlushConstantCost",(allocator<char> *)&local_880);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_318,"Flush: Approximated contant cost",(allocator<char> *)&local_8a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_380,"us",(allocator<char> *)&local_8c0);
  pLVar9 = &local_380;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,&local_7d8.m_name,&local_318.m_name,&pLVar9->m_name,
             QP_KEY_TAG_TIME,contributionFitting.offset);
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_17,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,"FlushLinearCost",(allocator<char> *)&local_8e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"Flush: Approximated linear cost",(allocator<char> *)&local_900);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b8,"us / MB",(allocator<char> *)&local_920);
  pLVar9 = &local_4b8;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_3e8.m_name,&local_450.m_name,
             &pLVar9->m_name,QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_18,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_520,"FlushMedianCost",(allocator<char> *)&local_940);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_588,"Flush: Median cost",(allocator<char> *)&local_960);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f0,"us",(allocator<char> *)&local_980);
  pLVar9 = &local_5f0;
  tcu::LogNumber<float>::LogNumber
            (&local_840,&local_520.m_name,&local_588.m_name,&pLVar9->m_name,QP_KEY_TAG_TIME,
             resultStats.flush.medianTime);
  tcu::LogNumber<float>::write(&local_840,__fd,__buf_19,(size_t)pLVar9);
  tcu::LogNumber<float>::~LogNumber(&local_840);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_520);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_3e8);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_7d8);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&values,"Results",(allocator<char> *)&local_840);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&processingRates,"Results",(allocator<char> *)&local_7d8);
  tcu::ScopedLogSection::ScopedLogSection
            (&section_2,log,(string *)&values,(string *)&processingRates);
  std::__cxx11::string::~string((string *)&processingRates);
  std::__cxx11::string::~string((string *)&values);
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pUVar2 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_afc = (float)((pUVar2[-1].bufferSize + pUVar1->bufferSize) / 2);
  fVar22 = theilSenFitting.coefficient * local_afc;
  fVar17 = theilSenFitting.offset + fVar22;
  uVar13 = (ulong)((long)pUVar2 - (long)pUVar1) >> 6;
  uVar13 = (long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff) / 2;
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>>
            ((LineParametersWithConfidence *)&values,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
              *)0x0,(int)uVar13,0x28,in_R9);
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>>
            ((LineParametersWithConfidence *)&processingRates,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
              *)(uVar13 & 0xffffffff),
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),0x28,in_R9);
  fVar21 = processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish._4_4_;
  fVar16 = processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  pUVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pUVar2 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  xmin = (float)pUVar1->writtenSize;
  fVar24 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  fVar3 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_;
  xmax = (float)pUVar2[-1].writtenSize;
  fVar18 = getAreaBetweenLines(xmin,xmax,
                               values.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_,
                               values.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,
                               processingRates.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_,
                               processingRates.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
            ((LineParametersWithConfidence *)&values,samples,0,
             (int)((ulong)((long)pUVar2 - (long)pUVar1) >> 6),2,0x28);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
            ((LineParametersWithConfidence *)&processingRates,samples,1,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),2,0x28);
  xmin_00 = (float)((samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                    )._M_impl.super__Vector_impl_data._M_start)->writtenSize;
  fVar25 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  fVar4 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_;
  xmax_00 = (float)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish[-1].writtenSize;
  fVar19 = getAreaBetweenLines(xmin_00,xmax_00,
                               values.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_,
                               values.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,
                               processingRates.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_,
                               processingRates.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contributionFitting,"ResultLinearity",&local_afd);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section_1,"Sample linearity",&local_afe);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_880,"%",&local_aff);
  fVar20 = fVar3 * xmin + fVar24;
  fVar23 = fVar21 * xmin + fVar16;
  uVar14 = -(uint)(fVar20 <= fVar23);
  fVar24 = fVar3 * xmax + fVar24;
  fVar16 = fVar21 * xmax + fVar16;
  uVar15 = -(uint)(fVar16 <= fVar24);
  fVar16 = ((float)(~uVar15 & (uint)fVar16 | (uint)fVar24 & uVar15) -
           (float)(~uVar14 & (uint)fVar23 | (uint)fVar20 & uVar14)) * (xmax - xmin);
  fVar21 = (float)(~-(uint)(fVar16 < 1e-06) & (uint)(1.0 - fVar18 / fVar16));
  fVar16 = 1.0;
  if (fVar21 <= 1.0) {
    fVar16 = fVar21;
  }
  psVar8 = &local_880;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,(string *)&contributionFitting,(string *)&section_1,psVar8,
             QP_KEY_TAG_QUALITY,(float)(~-(uint)(fVar21 < 0.0) & (uint)(fVar16 * 100.0)));
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_20,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8a0,"SampleTemporalStability",&local_b00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c0,"Sample temporal stability",&local_b01);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8e0,"%",&local_b02);
  fVar16 = fVar4 * xmin_00 + fVar25;
  fVar21 = processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish._4_4_ * xmin_00 +
           processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  uVar14 = -(uint)(fVar16 <= fVar21);
  fVar25 = fVar4 * xmax_00 + fVar25;
  fVar24 = processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish._4_4_ * xmax_00 +
           processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  uVar15 = -(uint)(fVar24 <= fVar25);
  fVar16 = ((float)(~uVar15 & (uint)fVar24 | (uint)fVar25 & uVar15) -
           (float)(~uVar14 & (uint)fVar21 | (uint)fVar16 & uVar14)) * (xmax_00 - xmin_00);
  fVar21 = (float)(~-(uint)(fVar16 < 1e-06) & (uint)(1.0 - fVar19 / fVar16));
  fVar16 = 1.0;
  if (fVar21 <= 1.0) {
    fVar16 = fVar21;
  }
  psVar8 = &local_8e0;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_8a0,&local_8c0,psVar8,QP_KEY_TAG_QUALITY,
             (float)(~-(uint)(fVar21 < 0.0) & (uint)(fVar16 * 100.0)));
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_21,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_900,"ApproximatedConstantCost",&local_b03);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_920,"Approximated contant cost",&local_b04);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_940,"us",&local_b05);
  psVar8 = &local_940;
  tcu::LogNumber<float>::LogNumber
            (&local_840,&local_900,&local_920,psVar8,QP_KEY_TAG_TIME,theilSenFitting.offset);
  tcu::LogNumber<float>::write(&local_840,__fd,__buf_22,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_960,"ApproximatedConstantCostConfidence60Lower",&local_b06);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_980,"Approximated contant cost 60% confidence lower limit",&local_b07)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_610,"us",&local_b08);
  psVar8 = &local_610;
  tcu::LogNumber<float>::LogNumber
            (&local_7d8,&local_960,&local_980,psVar8,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceLower);
  tcu::LogNumber<float>::write(&local_7d8,__fd,__buf_23,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_630,"ApproximatedConstantCostConfidence60Upper",&local_b09);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_650,"Approximated contant cost 60% confidence upper limit",&local_ae1)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_670,"us",&local_ae2);
  psVar8 = &local_670;
  tcu::LogNumber<float>::LogNumber
            (&local_318,&local_630,&local_650,psVar8,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceUpper);
  tcu::LogNumber<float>::write(&local_318,__fd,__buf_24,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_690,"ApproximatedLinearCost",&local_ae3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b0,"Approximated linear cost",&local_ae4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d0,"us / MB",&local_ae5);
  psVar8 = &local_6d0;
  tcu::LogNumber<float>::LogNumber
            (&local_380,&local_690,&local_6b0,psVar8,QP_KEY_TAG_TIME,
             theilSenFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write(&local_380,__fd,__buf_25,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f0,"ApproximatedLinearCostConfidence60Lower",&local_ae6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_710,"Approximated linear cost 60% confidence lower limit",&local_ae7);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_730,"us / MB",&local_ae8);
  psVar8 = &local_730;
  tcu::LogNumber<float>::LogNumber
            (&local_3e8,&local_6f0,&local_710,psVar8,QP_KEY_TAG_TIME,
             theilSenFitting.coefficientConfidenceLower * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write(&local_3e8,__fd,__buf_26,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_750,"ApproximatedLinearCostConfidence60Upper",&local_ae9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_770,"Approximated linear cost 60% confidence upper limit",&local_aea);
  std::__cxx11::string::string<std::allocator<char>>((string *)&section,"us / MB",&local_aeb);
  psVar8 = (string *)&section;
  tcu::LogNumber<float>::LogNumber
            (&local_450,&local_750,&local_770,psVar8,QP_KEY_TAG_TIME,
             theilSenFitting.coefficientConfidenceUpper * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write(&local_450,__fd,__buf_27,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"ApproximatedTransferRate",&local_aec);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"Approximated transfer rate",&local_aed);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"MB / s",&local_aee);
  fVar16 = local_afc / ((fVar17 / 1000.0) / 1000.0);
  psVar8 = &local_170;
  tcu::LogNumber<float>::LogNumber
            (&local_4b8,&local_130,&local_150,psVar8,QP_KEY_TAG_PERFORMANCE,
             fVar16 * 0.0009765625 * 0.0009765625);
  tcu::LogNumber<float>::write(&local_4b8,__fd,__buf_28,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"ApproximatedTransferRateNoConstant",&local_aef);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"Approximated transfer rate without constant cost",&local_af0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"MB / s",&local_af1);
  psVar8 = &local_1d0;
  tcu::LogNumber<float>::LogNumber
            (&local_520,&local_190,&local_1b0,psVar8,QP_KEY_TAG_PERFORMANCE,
             (local_afc / ((fVar22 / 1000.0) / 1000.0)) * 0.0009765625 * 0.0009765625);
  tcu::LogNumber<float>::write(&local_520,__fd,__buf_29,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"SampleMedianTime",&local_af2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"Median sample time",&local_af3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"us",&local_af4);
  psVar8 = &local_230;
  tcu::LogNumber<float>::LogNumber
            (&local_588,&local_1f0,&local_210,psVar8,QP_KEY_TAG_TIME,resultStats.result.medianTime);
  tcu::LogNumber<float>::write(&local_588,__fd,__buf_30,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"SampleMedianTransfer",&local_af5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"Median transfer rate",&local_af6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"MB / s",&local_af7);
  psVar8 = &local_290;
  tcu::LogNumber<float>::LogNumber
            (&local_5f0,&local_250,&local_270,psVar8,QP_KEY_TAG_PERFORMANCE,
             resultStats.medianRate * 0.0009765625 * 0.0009765625);
  tcu::LogNumber<float>::write(&local_5f0,__fd,__buf_31,(size_t)psVar8);
  tcu::LogNumber<float>::~LogNumber(&local_5f0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  tcu::LogNumber<float>::~LogNumber(&local_588);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  tcu::LogNumber<float>::~LogNumber(&local_520);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_190);
  tcu::LogNumber<float>::~LogNumber(&local_4b8);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  tcu::LogNumber<float>::~LogNumber(&local_450);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::~string((string *)&local_770);
  std::__cxx11::string::~string((string *)&local_750);
  tcu::LogNumber<float>::~LogNumber(&local_3e8);
  std::__cxx11::string::~string((string *)&local_730);
  std::__cxx11::string::~string((string *)&local_710);
  std::__cxx11::string::~string((string *)&local_6f0);
  tcu::LogNumber<float>::~LogNumber(&local_380);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::string::~string((string *)&local_690);
  tcu::LogNumber<float>::~LogNumber(&local_318);
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_630);
  tcu::LogNumber<float>::~LogNumber(&local_7d8);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::~string((string *)&local_980);
  std::__cxx11::string::~string((string *)&local_960);
  tcu::LogNumber<float>::~LogNumber(&local_840);
  std::__cxx11::string::~string((string *)&local_940);
  std::__cxx11::string::~string((string *)&local_920);
  std::__cxx11::string::~string((string *)&local_900);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::__cxx11::string::~string((string *)&local_8a0);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_880);
  std::__cxx11::string::~string((string *)&section_1);
  std::__cxx11::string::~string((string *)&contributionFitting);
  tcu::ScopedLogSection::~ScopedLogSection(&section_2);
  UVar26.transferRateAtRange = fVar16;
  UVar26.transferRateMedian = resultStats.medianRate;
  UVar26.transferRateAtInfinity = resultStats.medianRate;
  return UVar26;
}

Assistant:

static UploadSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<UploadSampleResult<SampleType> >& samples, bool logBucketPerformance)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedTransferRate;
	float													approximatedTransferRateNoConstant;

	// Output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Calculate results for different ranges
	if (logBucketPerformance)
	{
		const int										numBuckets				= 4;
		int												minBufferSize			= 0;
		int												maxBufferSize			= 0;
		std::vector<UploadSampleResult<SampleType> >	buckets[numBuckets];

		bucketizeSamplesUniformly(samples, &buckets[0], numBuckets, minBufferSize, maxBufferSize);

		for (int bucketNdx = 0; bucketNdx < numBuckets; ++bucketNdx)
		{
			if (buckets[bucketNdx].empty())
				continue;

			// Print a nice result summary

			const int												bucketRangeMin	= minBufferSize + (int)(((float) bucketNdx    / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const int												bucketRangeMax	= minBufferSize + (int)(((float)(bucketNdx+1) / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const typename SampleTypeTraits<SampleType>::StatsType	stats			= calculateSampleStatistics(theilSenFitting, buckets[bucketNdx]);
			const tcu::ScopedLogSection								section			(log, "BufferSizeRange", std::string("Transfer performance with buffer size in range [").append(getHumanReadableByteSize(bucketRangeMin).append(", ").append(getHumanReadableByteSize(bucketRangeMax).append("]"))));

			logMapRangeStats<SampleType>(log, stats);
			logUnmapStats<SampleType>(log, stats);
			logWriteStats<SampleType>(log, stats);
			logFlushStats<SampleType>(log, stats);
			logAllocStats<SampleType>(log, stats);

			log	<< tcu::TestLog::Float("Min", "Total: Min time", "us", QP_KEY_TAG_TIME, stats.result.minTime)
				<< tcu::TestLog::Float("Max", "Total: Max time", "us", QP_KEY_TAG_TIME, stats.result.maxTime)
				<< tcu::TestLog::Float("Min90", "Total: 90%-Min time", "us", QP_KEY_TAG_TIME, stats.result.min2DecileTime)
				<< tcu::TestLog::Float("Max90", "Total: 90%-Max time", "us", QP_KEY_TAG_TIME, stats.result.max9DecileTime)
				<< tcu::TestLog::Float("Median", "Total: Median time", "us", QP_KEY_TAG_TIME, stats.result.medianTime)
				<< tcu::TestLog::Float("MedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, stats.medianRate / 1024.0f / 1024.0f)
				<< tcu::TestLog::Float("MaxDiff", "Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiffTime)
				<< tcu::TestLog::Float("Max90Diff", "90%-Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiff9DecileTime)
				<< tcu::TestLog::Float("MedianDiff", "Median difference to approximated", "us", QP_KEY_TAG_TIME, stats.medianDiffTime)
				<< tcu::TestLog::Float("MaxRelDiff", "Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.maxRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("Max90RelDiff", "90%-Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.max9DecileRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("MedianRelDiff", "Median relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.medianRelDiffTime * 100.0f);
		}
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logMapContribution(log, samples, resultStats);
		logUnmapContribution(log, samples, resultStats);
		logWriteContribution(log, samples, resultStats);
		logFlushContribution(log, samples, resultStats);
		logAllocContribution(log, samples, resultStats);
	}

	// Print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianBufferSize					= (samples.front().bufferSize + samples.back().bufferSize) / 2;
		const float	approximatedTransferTime			= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	approximatedTransferTimeNoConstant	= (theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedTransferRateNoConstant				= (float)medianBufferSize / approximatedTransferTimeNoConstant;
		approximatedTransferRate						= (float)medianBufferSize / approximatedTransferTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRate", "Approximated transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRateNoConstant", "Approximated transfer rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated transfer rate
	{
		UploadSampleAnalyzeResult result;

		result.transferRateMedian = resultStats.medianRate;
		result.transferRateAtRange = approximatedTransferRate;
		result.transferRateAtInfinity = approximatedTransferRateNoConstant;

		return result;
	}
}